

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report_handler.cpp
# Opt level: O1

void sc_core::sc_report_handler::default_handler(sc_report *rep,sc_actions *actions)

{
  ostream *poVar1;
  char *pcVar2;
  sc_process_b *psVar3;
  sc_report *this;
  sc_report *rep_00;
  undefined1 auVar4 [16];
  string local_40;
  
  if ((*actions & 8) != 0) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    auVar4 = std::ostream::flush();
    sc_report_compose_message_abi_cxx11_(&local_40,(sc_core *)rep,auVar4._8_8_);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (auVar4._0_8_,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  if (((*actions & 4) != 0) && (log_file_name != (char *)0x0)) {
    sc_log_file_handle::update_file_name((sc_log_file_handle *)log_stream,log_file_name);
    sc_time::print(rep->timestamp,(ostream *)(log_stream + 0x20));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(log_stream + 0x20),": ",2);
    sc_report_compose_message_abi_cxx11_(&local_40,(sc_core *)rep,rep_00);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(log_stream + 0x20),local_40._M_dataplus._M_p,
                        local_40._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  if ((*actions & 0x40) != 0) {
    pcVar2 = sc_report::get_msg_type(rep);
    sc_stop_here(pcVar2,rep->severity);
    sc_stop();
  }
  if ((*actions & 0x20) != 0) {
    pcVar2 = sc_report::get_msg_type(rep);
    sc_interrupt_here(pcVar2,rep->severity);
  }
  if (-1 < (char)*actions) {
    if ((*actions & 2) == 0) {
      return;
    }
    psVar3 = sc_get_current_process_b();
    if ((psVar3 != (sc_process_b *)0x0) && (psVar3->m_unwinding == true)) {
      psVar3->m_unwinding = false;
    }
    this = (sc_report *)__cxa_allocate_exception(0x50);
    sc_report::sc_report(this,rep);
    __cxa_throw(this,&sc_report::typeinfo,sc_report::~sc_report);
  }
  sc_abort();
}

Assistant:

void sc_report_handler::default_handler(const sc_report& rep,
					const sc_actions& actions)
{
    if ( actions & SC_DISPLAY )
	::std::cout << ::std::endl << sc_report_compose_message(rep) << 
		::std::endl;

    if ( (actions & SC_LOG) && get_log_file_name() )
    {
		log_stream.update_file_name(get_log_file_name());

	*log_stream << rep.get_time() << ": "
	    << sc_report_compose_message(rep) << ::std::endl;
    }
    if ( actions & SC_STOP )
    {
	sc_stop_here(rep.get_msg_type(), rep.get_severity());
	sc_stop();
    }
    if ( actions & SC_INTERRUPT )
	sc_interrupt_here(rep.get_msg_type(), rep.get_severity());

    if ( actions & SC_ABORT )
        sc_abort();

    if ( actions & SC_THROW ) {
        sc_process_b* proc_p = sc_get_current_process_b();
        if( proc_p && proc_p->is_unwinding() )
            proc_p->clear_unwinding();
        throw rep; 
    }
}